

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

FloatCheckerboardTexture *
pbrt::FloatCheckerboardTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  FloatCheckerboardTexture *pFVar3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  undefined4 extraout_var_01;
  int dim;
  FloatTextureHandle tex2;
  FloatTextureHandle tex1;
  TextureMapping2DHandle map;
  int local_cc;
  undefined1 local_c8 [16];
  string local_b8;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 extraout_var_00;
  
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"dimension","");
  iVar2 = TextureParameterDictionary::GetOneInt(parameters,&local_b8,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_cc = iVar2;
  if (iVar2 - 4U < 0xfffffffe) {
    local_b8._M_string_length = 0;
    local_b8.field_2._M_allocated_capacity =
         local_b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    detail::stringPrintfRecursive<int&>
              (&local_b8,"%d dimensional checkerboard texture not supported",&local_cc);
    Error(loc,local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    pFVar3 = (FloatCheckerboardTexture *)0x0;
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"tex1","");
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)(local_c8 + 8),(string *)parameters,1.0,
               (memory_resource *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"tex2","");
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)local_c8,(string *)parameters,0.0,
               (memory_resource *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 2) {
      TextureMapping2DHandle::Create
                ((TextureMapping2DHandle *)&local_b8,parameters->dict,renderFromTexture,loc,alloc);
      iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
      pFVar3 = (FloatCheckerboardTexture *)CONCAT44(extraout_var,iVar2);
      (pFVar3->map2D).
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = (uintptr_t)local_b8._M_dataplus._M_p;
      (pFVar3->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits = 0;
      pFVar3->tex[0].
      super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
      .bits = local_c8._8_8_;
      pFVar3->tex[1].
      super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
      .bits = local_c8._0_8_;
    }
    else {
      local_b8._M_dataplus._M_p = *(pointer *)(renderFromTexture->mInv).m[0];
      local_b8._M_string_length = *(size_type *)((renderFromTexture->mInv).m[0] + 2);
      local_b8.field_2._M_allocated_capacity = *(undefined8 *)(renderFromTexture->mInv).m[1];
      local_b8.field_2._8_8_ = *(undefined8 *)((renderFromTexture->mInv).m[1] + 2);
      uStack_98 = *(undefined8 *)(renderFromTexture->mInv).m[2];
      uStack_90 = *(undefined8 *)((renderFromTexture->mInv).m[2] + 2);
      uStack_88 = *(undefined8 *)(renderFromTexture->mInv).m[3];
      uStack_80 = *(undefined8 *)((renderFromTexture->mInv).m[3] + 2);
      local_78 = *(undefined8 *)(renderFromTexture->m).m[0];
      uStack_70 = *(undefined8 *)((renderFromTexture->m).m[0] + 2);
      uStack_68 = *(undefined8 *)(renderFromTexture->m).m[1];
      uStack_60 = *(undefined8 *)((renderFromTexture->m).m[1] + 2);
      uStack_58 = *(undefined8 *)(renderFromTexture->m).m[2];
      uStack_50 = *(undefined8 *)((renderFromTexture->m).m[2] + 2);
      uStack_48 = *(undefined8 *)(renderFromTexture->m).m[3];
      uStack_40 = *(undefined8 *)((renderFromTexture->m).m[3] + 2);
      iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x80,4);
      puVar4 = (undefined8 *)CONCAT44(extraout_var_00,iVar2);
      *puVar4 = local_b8._M_dataplus._M_p;
      puVar4[1] = local_b8._M_string_length;
      puVar4[2] = local_b8.field_2._M_allocated_capacity;
      puVar4[3] = local_b8.field_2._8_8_;
      puVar4[4] = uStack_98;
      puVar4[5] = uStack_90;
      puVar4[6] = uStack_88;
      puVar4[7] = uStack_80;
      puVar4[8] = local_78;
      puVar4[9] = uStack_70;
      puVar4[10] = uStack_68;
      puVar4[0xb] = uStack_60;
      puVar4[0xc] = uStack_58;
      puVar4[0xd] = uStack_50;
      puVar4[0xe] = uStack_48;
      puVar4[0xf] = uStack_40;
      iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
      pFVar3 = (FloatCheckerboardTexture *)CONCAT44(extraout_var_01,iVar2);
      (pFVar3->map2D).
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = 0;
      (pFVar3->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits =
           (ulong)puVar4 | 0x1000000000000;
      pFVar3->tex[0].
      super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
      .bits = local_c8._8_8_;
      pFVar3->tex[1].
      super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
      .bits = local_c8._0_8_;
    }
  }
  return pFVar3;
}

Assistant:

FloatCheckerboardTexture *FloatCheckerboardTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    int dim = parameters.GetOneInt("dimension", 2);
    if (dim != 2 && dim != 3) {
        Error(loc, "%d dimensional checkerboard texture not supported", dim);
        return nullptr;
    }
    FloatTextureHandle tex1 = parameters.GetFloatTexture("tex1", 1.f, alloc);
    FloatTextureHandle tex2 = parameters.GetFloatTexture("tex2", 0.f, alloc);
    if (dim == 2) {
        // Initialize 2D texture mapping _map_ from _tp_
        TextureMapping2DHandle map =
            TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

        return alloc.new_object<FloatCheckerboardTexture>(map, nullptr, tex1, tex2);
    } else {
        // Initialize 3D texture mapping _map_ from _tp_
        TextureMapping3DHandle map =
            TextureMapping3DHandle::Create(parameters, renderFromTexture, loc, alloc);
        return alloc.new_object<FloatCheckerboardTexture>(nullptr, map, tex1, tex2);
    }
}